

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_eval.c
# Opt level: O2

l2_expr_info *
l2_eval_expr_logic_or1
          (l2_expr_info *__return_storage_ptr__,l2_scope *scope_p,l2_expr_info left_expr_info)

{
  l2_expr_info left_expr_info_00;
  l2_parsing_error_type error_type;
  boolean bVar1;
  l2_token *plVar2;
  int cols;
  int lines;
  l2_expr_info new_left_expr_info;
  
  bVar1 = l2_parse_probe_next_token_by_type(L2_TOKEN_LOGIC_OR);
  if (bVar1 == '\0') {
    (__return_storage_ptr__->val).procedure.upper_scope_p =
         left_expr_info.val.procedure.upper_scope_p;
    *(long *)__return_storage_ptr__ = left_expr_info._0_8_;
    (__return_storage_ptr__->val).integer = left_expr_info.val._0_8_;
    return __return_storage_ptr__;
  }
  l2_parse_token_forward();
  plVar2 = l2_parse_token_current();
  l2_eval_expr_logic_and(&new_left_expr_info,scope_p);
  if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_BOOL) {
    if (new_left_expr_info.val_type == L2_EXPR_VAL_TYPE_BOOL) {
      new_left_expr_info.val.bool =
           new_left_expr_info.val.bool != '\0' || left_expr_info.val.bool != '\0';
      new_left_expr_info.val_type = L2_EXPR_VAL_TYPE_BOOL;
      left_expr_info_00._4_4_ = new_left_expr_info._4_4_;
      left_expr_info_00.val_type = 4;
      left_expr_info_00.val.integer._1_7_ = new_left_expr_info.val.integer._1_7_;
      left_expr_info_00.val.bool = new_left_expr_info.val.bool;
      left_expr_info_00.val.procedure.upper_scope_p = new_left_expr_info.val.procedure.upper_scope_p
      ;
      l2_eval_expr_logic_or1(__return_storage_ptr__,scope_p,left_expr_info_00);
      return __return_storage_ptr__;
    }
    lines = plVar2->current_line;
    cols = plVar2->current_col;
    error_type = L2_PARSING_ERROR_RIGHT_SIDE_OF_OPERATOR_MUST_BE_A_BOOL_VALUE;
  }
  else {
    lines = plVar2->current_line;
    cols = plVar2->current_col;
    error_type = L2_PARSING_ERROR_LEFT_SIDE_OF_OPERATOR_MUST_BE_A_BOOL_VALUE;
  }
  l2_parsing_error(error_type,lines,cols,"||");
}

Assistant:

l2_expr_info l2_eval_expr_logic_or1(l2_scope *scope_p, l2_expr_info left_expr_info) {
    l2_expr_info right_expr_info, new_left_expr_info;
    _declr_current_token_p
    _if_type (L2_TOKEN_LOGIC_OR)
    {
        _get_current_token_p
        right_expr_info = l2_eval_expr_logic_and(scope_p);
        _if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_BOOL)
        {
            _if (right_expr_info.val_type == L2_EXPR_VAL_TYPE_BOOL)
            {
                new_left_expr_info.val_type = L2_EXPR_VAL_TYPE_BOOL;
                new_left_expr_info.val.bool = (left_expr_info.val.bool || right_expr_info.val.bool);
                return l2_eval_expr_logic_or1(scope_p, new_left_expr_info);

            } _throw_right_expr_not_bool("||")

        } _throw_left_expr_not_bool("||")

    }
    _else
    {
        return left_expr_info;
    }
}